

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O1

vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
* deqp::gles31::Functional::anon_unknown_0::generateBasic2DCaseIterations
            (vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
             *__return_storage_ptr__,GatherType gatherType,TextureFormat *textureFormat,
            IVec2 *offsetRange)

{
  ChannelOrder CVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  value_type local_7c;
  ulong local_58;
  int local_50;
  GatherType local_4c;
  IVec2 *local_48;
  ulong local_40;
  ulong local_38;
  
  CVar1 = textureFormat->order;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar13 = 0;
  local_38 = (ulong)gatherType;
  local_4c = gatherType;
  local_48 = offsetRange;
  do {
    if (local_4c < GATHERTYPE_LAST) {
      iVar11 = uVar13 - 1;
      local_7c.componentNdx = iVar11;
      switch((long)&switchD_005fe793::switchdataD_009c01ac +
             (long)(int)(&switchD_005fe793::switchdataD_009c01ac)[local_38]) {
      case 0x5fe795:
        local_7c.offsets[2].m_data[0] = 0;
        local_7c.offsets[2].m_data[1] = 0;
        local_7c.offsets[3].m_data[0] = 0;
        local_7c.offsets[3].m_data[1] = 0;
        local_7c.offsets[0].m_data[0] = 0;
        local_7c.offsets[0].m_data[1] = 0;
        local_7c.offsets[1].m_data[0] = 0;
        local_7c.offsets[1].m_data[1] = 0;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_7c);
        break;
      case 0x5fe7b9:
        local_7c.offsets[2].m_data[0] = 0;
        local_7c.offsets[2].m_data[1] = 0;
        local_7c.offsets[3].m_data[0] = 0;
        local_7c.offsets[3].m_data[1] = 0;
        local_7c.offsets[0].m_data[0] = 0;
        local_7c.offsets[0].m_data[1] = 0;
        local_7c.offsets[1].m_data[0] = 0;
        local_7c.offsets[1].m_data[1] = 0;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_7c);
        break;
      case 0x5fe7dd:
        uVar2 = local_48->m_data[0];
        local_58 = (ulong)uVar2;
        iVar3 = local_48->m_data[1];
        local_7c.offsets[1].m_data = *&local_48->m_data;
        uVar5 = -uVar2;
        if (0 < (int)uVar2) {
          uVar5 = uVar2;
        }
        iVar6 = (int)uVar2 >> 0x1f;
        if (0 < (int)uVar2) {
          iVar6 = 1;
        }
        iVar7 = -iVar3;
        if (0 < iVar3) {
          iVar7 = iVar3;
        }
        iVar8 = iVar3 >> 0x1f;
        if (0 < iVar3) {
          iVar8 = 1;
        }
        local_7c.offsets[0].m_data[1] = uVar2;
        local_7c.offsets[0].m_data[0] = uVar2;
        local_7c.offsets[2].m_data[1] = uVar2;
        local_7c.offsets[2].m_data[0] = iVar3;
        local_7c.offsets[3].m_data[1] = iVar3;
        local_7c.offsets[3].m_data[0] = iVar3;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_7c);
        if (uVar13 == 0) {
          local_7c.offsets[3].m_data[0] = (iVar7 / 2) * iVar8;
          local_7c.offsets[3].m_data[1] = 0;
          local_7c.offsets[2].m_data = local_7c.offsets[3].m_data << 0x20;
          local_7c.offsets[0].m_data = local_58 | local_7c.offsets[2].m_data;
          local_7c.offsets[1].m_data[1] = iVar3;
          local_7c.offsets[1].m_data[0] = ((int)uVar5 / 2) * iVar6;
          local_7c.componentNdx = iVar11;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
          ::push_back(__return_storage_ptr__,&local_7c);
        }
        break;
      case 0x5fe8e9:
        uVar2 = local_48->m_data[0];
        uVar5 = -uVar2;
        if (0 < (int)uVar2) {
          uVar5 = uVar2;
        }
        uVar4 = local_48->m_data[1];
        local_58 = (ulong)uVar4;
        local_50 = (int)uVar2 >> 0x1f;
        if (0 < (int)uVar2) {
          local_50 = 1;
        }
        uVar9 = -uVar4;
        if (0 < (int)uVar4) {
          uVar9 = uVar4;
        }
        iVar3 = (int)uVar4 >> 0x1f;
        if (0 < (int)uVar4) {
          iVar3 = 1;
        }
        uVar12 = local_58 << 0x20;
        local_7c.offsets[0].m_data[1] = uVar4;
        local_7c.offsets[0].m_data[0] = uVar2;
        local_7c.offsets[1].m_data[0] = 0;
        local_7c.offsets[1].m_data[1] = 0;
        local_7c.offsets[2].m_data[0] = 0;
        local_7c.offsets[2].m_data[1] = 0;
        local_7c.offsets[3].m_data[0] = 0;
        local_7c.offsets[3].m_data[1] = 0;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_7c);
        if (uVar13 == 0) {
          local_40 = (ulong)uVar2 << 0x20;
          local_7c.offsets[0].m_data[1] = uVar2;
          local_7c.offsets[1].m_data[0] = 0;
          local_7c.offsets[1].m_data[1] = 0;
          local_7c.offsets[2].m_data[0] = 0;
          local_7c.offsets[2].m_data[1] = 0;
          local_7c.offsets[3].m_data[0] = 0;
          local_7c.offsets[3].m_data[1] = 0;
          local_7c.componentNdx = iVar11;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
          ::push_back(__return_storage_ptr__,&local_7c);
          uVar10 = local_58;
          local_7c.offsets[0].m_data = (int  [2])(local_40 | local_58);
          local_7c.offsets[1].m_data[0] = 0;
          local_7c.offsets[1].m_data[1] = 0;
          local_7c.offsets[2].m_data[0] = 0;
          local_7c.offsets[2].m_data[1] = 0;
          local_7c.offsets[3].m_data[0] = 0;
          local_7c.offsets[3].m_data[1] = 0;
          local_7c.componentNdx = iVar11;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
          ::push_back(__return_storage_ptr__,&local_7c);
          local_7c.offsets[0].m_data = (int  [2])(uVar12 | uVar10);
          local_7c.offsets[1].m_data[0] = 0;
          local_7c.offsets[1].m_data[1] = 0;
          local_7c.offsets[2].m_data[0] = 0;
          local_7c.offsets[2].m_data[1] = 0;
          local_7c.offsets[3].m_data[0] = 0;
          local_7c.offsets[3].m_data[1] = 0;
          local_7c.componentNdx = iVar11;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
          ::push_back(__return_storage_ptr__,&local_7c);
          local_7c.offsets[0].m_data = (int  [2])((ulong)(uint)(((int)uVar9 / 2) * iVar3) << 0x20);
          local_7c.offsets[1].m_data[0] = 0;
          local_7c.offsets[1].m_data[1] = 0;
          local_7c.offsets[2].m_data[0] = 0;
          local_7c.offsets[2].m_data[1] = 0;
          local_7c.offsets[3].m_data[0] = 0;
          local_7c.offsets[3].m_data[1] = 0;
          local_7c.componentNdx = iVar11;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
          ::push_back(__return_storage_ptr__,&local_7c);
          local_7c.offsets[0].m_data[0] = ((int)uVar5 / 2) * local_50;
          local_7c.offsets[0].m_data[1] = 0;
          local_7c.offsets[1].m_data[0] = 0;
          local_7c.offsets[1].m_data[1] = 0;
          local_7c.offsets[2].m_data[0] = 0;
          local_7c.offsets[2].m_data[1] = 0;
          local_7c.offsets[3].m_data[0] = 0;
          local_7c.offsets[3].m_data[1] = 0;
          local_7c.componentNdx = iVar11;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
          ::push_back(__return_storage_ptr__,&local_7c);
          local_7c.offsets[2].m_data[0] = 0;
          local_7c.offsets[2].m_data[1] = 0;
          local_7c.offsets[3].m_data[0] = 0;
          local_7c.offsets[3].m_data[1] = 0;
          local_7c.offsets[0].m_data[0] = 0;
          local_7c.offsets[0].m_data[1] = 0;
          local_7c.offsets[1].m_data[0] = 0;
          local_7c.offsets[1].m_data[1] = 0;
          local_7c.componentNdx = iVar11;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
          ::push_back(__return_storage_ptr__,&local_7c);
        }
      }
    }
  } while (((uVar13 < 4) && (CVar1 != D)) && (uVar13 = uVar13 + 1, CVar1 != DS));
  return __return_storage_ptr__;
}

Assistant:

vector<GatherArgs> generateBasic2DCaseIterations (GatherType gatherType, const tcu::TextureFormat& textureFormat, const IVec2& offsetRange)
{
	const int			numComponentCases	= isDepthFormat(textureFormat) ? 1 : 4+1; // \note For non-depth textures, test explicit components 0 to 3 and implicit component 0.
	vector<GatherArgs>	result;

	for (int componentCaseNdx = 0; componentCaseNdx < numComponentCases; componentCaseNdx++)
	{
		const int componentNdx = componentCaseNdx - 1;

		switch (gatherType)
		{
			case GATHERTYPE_BASIC:
				result.push_back(GatherArgs(componentNdx));
				break;

			case GATHERTYPE_OFFSET:
			{
				const int min	= offsetRange.x();
				const int max	= offsetRange.y();
				const int hmin	= divRoundToZero(min, 2);
				const int hmax	= divRoundToZero(max, 2);

				result.push_back(GatherArgs(componentNdx, IVec2(min, max)));

				if (componentCaseNdx == 0) // Don't test all offsets variants for all color components (they should be pretty orthogonal).
				{
					result.push_back(GatherArgs(componentNdx, IVec2(min,	min)));
					result.push_back(GatherArgs(componentNdx, IVec2(max,	min)));
					result.push_back(GatherArgs(componentNdx, IVec2(max,	max)));

					result.push_back(GatherArgs(componentNdx, IVec2(0,		hmax)));
					result.push_back(GatherArgs(componentNdx, IVec2(hmin,	0)));
					result.push_back(GatherArgs(componentNdx, IVec2(0,		0)));
				}

				break;
			}

			case GATHERTYPE_OFFSET_DYNAMIC:
				result.push_back(GatherArgs(componentNdx));
				break;

			case GATHERTYPE_OFFSETS:
			{
				const int min	= offsetRange.x();
				const int max	= offsetRange.y();
				const int hmin	= divRoundToZero(min, 2);
				const int hmax	= divRoundToZero(max, 2);

				result.push_back(GatherArgs(componentNdx,
											IVec2(min,	min),
											IVec2(min,	max),
											IVec2(max,	min),
											IVec2(max,	max)));

				if (componentCaseNdx == 0) // Don't test all offsets variants for all color components (they should be pretty orthogonal).
					result.push_back(GatherArgs(componentNdx,
												IVec2(min,	hmax),
												IVec2(hmin,	max),
												IVec2(0,	hmax),
												IVec2(hmax,	0)));
				break;
			}

			default:
				DE_ASSERT(false);
		}
	}

	return result;
}